

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmArrayIndex(ExpressionContext *ctx,VmModule *module,ExprArrayIndex *node)

{
  SynBase *pSVar1;
  VmValue *pVVar2;
  VmValue *index_00;
  TypeUnsizedArray *pTVar3;
  VmConstant *pVVar4;
  TypeRef *pTVar5;
  TypeArray *pTVar6;
  VmConstant *elementSize_00;
  VmValue *elementSize;
  VmValue *arrayLength;
  TypeArray *arrayType;
  TypeRef *refType;
  VmValue *elementSize_1;
  TypeUnsizedArray *arrayType_1;
  VmValue *index;
  VmValue *value;
  ExprArrayIndex *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  pVVar2 = CompileVm(ctx,module,node->value);
  index_00 = CompileVm(ctx,module,node->index);
  pTVar3 = getType<TypeUnsizedArray>(node->value->type);
  if (pTVar3 == (TypeUnsizedArray *)0x0) {
    pTVar5 = getType<TypeRef>(node->value->type);
    if (pTVar5 == (TypeRef *)0x0) {
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0xd08,
                    "VmValue *CompileVmArrayIndex(ExpressionContext &, VmModule *, ExprArrayIndex *)"
                   );
    }
    pTVar6 = getType<TypeArray>(pTVar5->subType);
    if (pTVar6 == (TypeArray *)0x0) {
      __assert_fail("arrayType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0xd0c,
                    "VmValue *CompileVmArrayIndex(ExpressionContext &, VmModule *, ExprArrayIndex *)"
                   );
    }
    if ((pTVar6->subType->size & 0xffffffffU) != pTVar6->subType->size) {
      __assert_fail("unsigned(arrayType->subType->size) == arrayType->subType->size",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0xd0d,
                    "VmValue *CompileVmArrayIndex(ExpressionContext &, VmModule *, ExprArrayIndex *)"
                   );
    }
    pVVar4 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,(int)pTVar6->length);
    elementSize_00 =
         CreateConstantInt(module->allocator,(node->super_ExprBase).source,
                           (int)pTVar6->subType->size);
    pSVar1 = (node->super_ExprBase).source;
    pTVar5 = ExpressionContext::GetReferenceType(ctx,pTVar6->subType);
    pVVar2 = anon_unknown.dwarf_1a3010::CreateIndex
                       (module,pSVar1,&pVVar4->super_VmValue,&elementSize_00->super_VmValue,pVVar2,
                        index_00,&pTVar5->super_TypeBase);
    ctx_local = (ExpressionContext *)
                anon_unknown.dwarf_1a3010::CheckType(ctx,&node->super_ExprBase,pVVar2);
  }
  else {
    pVVar4 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,
                               (int)pTVar3->subType->size);
    pSVar1 = (node->super_ExprBase).source;
    pTVar5 = ExpressionContext::GetReferenceType(ctx,pTVar3->subType);
    pVVar2 = anon_unknown.dwarf_1a3010::CreateIndexUnsized
                       (module,pSVar1,&pVVar4->super_VmValue,pVVar2,index_00,&pTVar5->super_TypeBase
                       );
    ctx_local = (ExpressionContext *)
                anon_unknown.dwarf_1a3010::CheckType(ctx,&node->super_ExprBase,pVVar2);
  }
  return (VmValue *)ctx_local;
}

Assistant:

VmValue* CompileVmArrayIndex(ExpressionContext &ctx, VmModule *module, ExprArrayIndex *node)
{
	VmValue *value = CompileVm(ctx, module, node->value);
	VmValue *index = CompileVm(ctx, module, node->index);

	if(TypeUnsizedArray *arrayType = getType<TypeUnsizedArray>(node->value->type))
	{
		VmValue *elementSize = CreateConstantInt(module->allocator, node->source, unsigned(arrayType->subType->size));

		return CheckType(ctx, node, CreateIndexUnsized(module, node->source, elementSize, value, index, ctx.GetReferenceType(arrayType->subType)));
	}

	TypeRef *refType = getType<TypeRef>(node->value->type);

	assert(refType);

	TypeArray *arrayType = getType<TypeArray>(refType->subType);

	assert(arrayType);
	assert(unsigned(arrayType->subType->size) == arrayType->subType->size);

	VmValue *arrayLength = CreateConstantInt(module->allocator, node->source, unsigned(arrayType->length));
	VmValue *elementSize = CreateConstantInt(module->allocator, node->source, unsigned(arrayType->subType->size));

	return CheckType(ctx, node, CreateIndex(module, node->source, arrayLength, elementSize, value, index, ctx.GetReferenceType(arrayType->subType)));
}